

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O1

string * __thiscall
flatbuffers::dart::DartGenerator::getDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,Value *value)

{
  string *s;
  BaseType BVar1;
  EnumDef *pEVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  
  if ((value->constant)._M_string_length != 0) {
    s = &value->constant;
    iVar5 = std::__cxx11::string::compare((char *)s);
    if (iVar5 != 0) {
      BVar1 = (value->type).base_type;
      if (BVar1 == BASE_TYPE_BOOL) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar7 = "true";
        pcVar6 = "";
      }
      else {
        if (0xb < BVar1 - BASE_TYPE_UTYPE) {
LAB_001d71d1:
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = (value->constant)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,pcVar3,
                     pcVar3 + (value->constant)._M_string_length);
          return __return_storage_ptr__;
        }
        iVar5 = std::__cxx11::string::compare((char *)s);
        if (((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)s), iVar5 == 0)) ||
           (iVar5 = std::__cxx11::string::compare((char *)s), iVar5 == 0)) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar7 = "double.nan";
          pcVar6 = "";
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)s);
          if (((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)s), iVar5 == 0)) ||
             ((iVar5 = std::__cxx11::string::compare((char *)s), iVar5 == 0 ||
              (iVar5 = std::__cxx11::string::compare((char *)s), iVar5 == 0)))) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar7 = "double.infinity";
            pcVar6 = "";
          }
          else {
            bVar4 = StringIsFlatbufferNegativeInfinity(s);
            if (!bVar4) goto LAB_001d71d1;
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar7 = "double.negativeInfinity";
            pcVar6 = "";
          }
        }
      }
      goto LAB_001d721c;
    }
  }
  BVar1 = (value->type).base_type;
  if (BVar1 == BASE_TYPE_BOOL) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "false";
    pcVar6 = "";
  }
  else if ((BVar1 - BASE_TYPE_UTYPE < 0xc) &&
          ((pEVar2 = (value->type).enum_def, pEVar2 == (EnumDef *)0x0 || (pEVar2->is_union == false)
           ))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "0";
    pcVar6 = "";
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "";
    pcVar7 = "";
  }
LAB_001d721c:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string getDefaultValue(const Value &value) const {
    if (!value.constant.empty() && value.constant != "0") {
      if (IsBool(value.type.base_type)) { return "true"; }
      if (IsScalar(value.type.base_type)) {
        if (StringIsFlatbufferNan(value.constant)) {
          return "double.nan";
        } else if (StringIsFlatbufferPositiveInfinity(value.constant)) {
          return "double.infinity";
        } else if (StringIsFlatbufferNegativeInfinity(value.constant)) {
          return "double.negativeInfinity";
        }
      }
      return value.constant;
    } else if (IsBool(value.type.base_type)) {
      return "false";
    } else if (IsScalar(value.type.base_type) && !IsUnion(value.type)) {
      return "0";
    } else {
      return "";
    }
  }